

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void __thiscall ParseFloat_Rounding_Test::TestBody(ParseFloat_Rounding_Test *this)

{
  anon_unknown.dwarf_b78f2::AssertHexFloatEquals(0x7f7ffffd,"0x1.fffffap127");
  anon_unknown.dwarf_b78f2::AssertHexFloatEquals(0x7f7ffffe,"0x1.fffffbp127");
  anon_unknown.dwarf_b78f2::AssertHexFloatEquals(0x7f7ffffe,"0x1.fffffcp127");
  anon_unknown.dwarf_b78f2::AssertHexFloatEquals(0x7f7ffffe,"0x1.fffffdp127");
  anon_unknown.dwarf_b78f2::AssertHexFloatEquals(0x7f7fffff,"0x1.fffffep127");
  return;
}

Assistant:

TEST(ParseFloat, Rounding) {
  // |------- 23 bits -----| V-- extra bit
  //
  // 11111111111111111111101 0  ==> no rounding
  AssertHexFloatEquals(0x7f7ffffd, "0x1.fffffap127");
  // 11111111111111111111101 1  ==> round up
  AssertHexFloatEquals(0x7f7ffffe, "0x1.fffffbp127");
  // 11111111111111111111110 0  ==> no rounding
  AssertHexFloatEquals(0x7f7ffffe, "0x1.fffffcp127");
  // 11111111111111111111110 1  ==> round down
  AssertHexFloatEquals(0x7f7ffffe, "0x1.fffffdp127");
  // 11111111111111111111111 0  ==> no rounding
  AssertHexFloatEquals(0x7f7fffff, "0x1.fffffep127");
}